

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QModelIndex * __thiscall
QTreeView::indexBelow(QModelIndex *__return_storage_ptr__,QTreeView *this,QModelIndex *index)

{
  QTreeViewItem *pQVar1;
  QTreeViewPrivate *this_00;
  QTreeViewItem *pQVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar3 = QAbstractItemViewPrivate::isIndexValid(&this_00->super_QAbstractItemViewPrivate,index);
  if (bVar3) {
    QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
    iVar4 = QTreeViewPrivate::viewIndex(this_00,index);
    lVar5 = (long)(iVar4 + 1);
    if (lVar5 < (this_00->viewItems).d.size) {
      pQVar2 = (this_00->viewItems).d.ptr;
      pQVar1 = pQVar2 + lVar5;
      local_38.r = (pQVar1->index).r;
      local_38.c = (pQVar1->index).c;
      local_38.i = (pQVar1->index).i;
      local_38.m.ptr = pQVar2[lVar5].index.m.ptr;
      QModelIndex::sibling(__return_storage_ptr__,&local_38,local_38.r,index->c);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
      goto LAB_0054087a;
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
    return __return_storage_ptr__;
  }
LAB_0054087a:
  __stack_chk_fail();
}

Assistant:

QModelIndex QTreeView::indexBelow(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    if (!d->isIndexValid(index))
        return QModelIndex();
    d->executePostedLayout();
    int i = d->viewIndex(index);
    if (++i >= d->viewItems.size())
        return QModelIndex();
    const QModelIndex firstColumnIndex = d->viewItems.at(i).index;
    return firstColumnIndex.sibling(firstColumnIndex.row(), index.column());
}